

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O3

int __thiscall Fl_Slider::handle(Fl_Slider *this,int event,int X,int Y,int W,int H)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_48;
  int local_3c;
  double local_38;
  
  iVar6 = 1;
  switch(event) {
  case 1:
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_48,(Fl_Widget *)this);
    iVar6 = Fl::event_inside(X,Y,W,H);
    if (iVar6 == 0) {
      iVar6 = 0;
      goto switchD_001ca1d3_default;
    }
    (this->super_Fl_Valuator).previous_value_ = (this->super_Fl_Valuator).value_;
    if (local_48.wp_ == (Fl_Widget *)0x0) goto LAB_001ca451;
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_48);
  case 5:
    dVar10 = (this->super_Fl_Valuator).min;
    dVar11 = (this->super_Fl_Valuator).max;
    if ((dVar10 != dVar11) || (NAN(dVar10) || NAN(dVar11))) {
      dVar11 = ((this->super_Fl_Valuator).value_ - dVar10) / (dVar11 - dVar10);
      dVar10 = 1.0;
      if ((dVar11 <= 1.0) && (dVar10 = dVar11, dVar11 < 0.0)) {
        dVar10 = 0.0;
      }
    }
    else {
      dVar10 = 0.5;
    }
    bVar1 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
    iVar6 = Fl::e_y - Y;
    local_3c = H;
    if ((bVar1 & 1) != 0) {
      iVar6 = Fl::e_x - X;
      local_3c = W;
    }
    iVar7 = handle::offcenter;
    if ((bVar1 & 0xfe) == 2) {
      iVar4 = 0;
      if (event != 1) goto LAB_001ca4c0;
      handle::offcenter = iVar6 - (int)(dVar10 * (double)local_3c + 0.5);
      iVar4 = 0;
      iVar7 = iVar4;
      if (handle::offcenter - 0xbU < 0xffffffeb) goto LAB_001ca4c0;
    }
    else {
      iVar4 = (int)((float)local_3c * *(float *)&(this->super_Fl_Valuator).field_0xa4 + 0.5);
      if (local_3c <= iVar4) goto switchD_001ca172_default;
      uVar9 = (ulong)(uint)H;
      if ((bVar1 & 1) == 0) {
        uVar9 = (ulong)(uint)W;
      }
      iVar8 = ((int)(uVar9 >> 0x1f) + (int)uVar9 >> 1) + (uint)((bVar1 & 0xfe) == 4) * 4 + 1;
      if (iVar4 < iVar8) {
        iVar4 = iVar8;
      }
      if (event == 1) {
        handle::offcenter = iVar6 - (int)(dVar10 * (double)(local_3c - iVar4) + 0.5);
        if (handle::offcenter < 0) {
          iVar7 = 0;
        }
        else {
          iVar7 = iVar4;
          if (handle::offcenter <= iVar4) goto LAB_001ca591;
        }
      }
LAB_001ca4c0:
      handle::offcenter = iVar7;
      iVar8 = iVar6 - handle::offcenter;
      local_3c = local_3c - iVar4;
      local_38 = (double)local_3c;
      iVar7 = iVar6 - local_3c;
      if (iVar4 <= iVar6 - local_3c) {
        iVar7 = iVar4;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      bVar3 = event == 1;
      while( true ) {
        iVar2 = 0;
        iVar5 = iVar6;
        if ((iVar8 < 0) || (iVar2 = local_3c, iVar5 = iVar7, local_3c < iVar8)) {
          iVar8 = iVar2;
          handle::offcenter = iVar5;
        }
        dVar10 = (this->super_Fl_Valuator).min;
        dVar10 = Fl_Valuator::round(&this->super_Fl_Valuator,
                                    (((this->super_Fl_Valuator).max - dVar10) * (double)iVar8) /
                                    local_38 + dVar10);
        if (!(bool)(bVar3 & dVar10 == (this->super_Fl_Valuator).value_)) break;
        bVar3 = false;
        handle::offcenter = iVar4 / 2;
      }
      dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
    }
LAB_001ca591:
    iVar6 = 1;
    break;
  case 2:
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    break;
  case 3:
  case 4:
    break;
  case 6:
  case 7:
    bVar3 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (bVar3) {
      Fl_Widget::redraw((Fl_Widget *)this);
      return 1;
    }
  default:
switchD_001ca172_default:
    iVar6 = 0;
    break;
  case 8:
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_48,(Fl_Widget *)this);
    iVar7 = 0;
    iVar6 = 0;
    switch(Fl::e_keysym) {
    case 0xff51:
      iVar6 = iVar7;
      if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 1) != 0) {
        dVar10 = (this->super_Fl_Valuator).value_;
        (this->super_Fl_Valuator).previous_value_ = dVar10;
        iVar6 = 1;
        if (local_48.wp_ != (Fl_Widget *)0x0) {
          dVar10 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar10,-1);
          dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
          Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
LAB_001ca496:
          iVar6 = 1;
          if (local_48.wp_ != (Fl_Widget *)0x0) {
LAB_001ca49d:
            Fl_Valuator::handle_release(&this->super_Fl_Valuator);
            iVar6 = 1;
          }
        }
      }
      break;
    case 0xff52:
      iVar6 = iVar7;
      if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 1) == 0) {
        dVar10 = (this->super_Fl_Valuator).value_;
        (this->super_Fl_Valuator).previous_value_ = dVar10;
        iVar6 = 1;
        if (local_48.wp_ != (Fl_Widget *)0x0) {
          dVar10 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar10,-1);
          dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
          Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
          goto LAB_001ca496;
        }
      }
      break;
    case 0xff53:
      iVar6 = iVar7;
      if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 1) != 0) {
        dVar10 = (this->super_Fl_Valuator).value_;
        (this->super_Fl_Valuator).previous_value_ = dVar10;
        if (local_48.wp_ != (Fl_Widget *)0x0) {
          dVar10 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar10,1);
          dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
          Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
LAB_001ca44a:
          if (local_48.wp_ != (Fl_Widget *)0x0) goto LAB_001ca49d;
        }
LAB_001ca451:
        iVar6 = 1;
      }
      break;
    case 0xff54:
      iVar6 = iVar7;
      if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 1) == 0) {
        dVar10 = (this->super_Fl_Valuator).value_;
        (this->super_Fl_Valuator).previous_value_ = dVar10;
        if (local_48.wp_ != (Fl_Widget *)0x0) {
          dVar10 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar10,1);
          dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
          Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
          goto LAB_001ca44a;
        }
        goto LAB_001ca451;
      }
    }
switchD_001ca1d3_default:
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_48);
  }
  return iVar6;
}

Assistant:

int Fl_Slider::handle(int event, int X, int Y, int W, int H) {
  // Fl_Widget_Tracker wp(this);
  switch (event) {
  case FL_PUSH: {
    Fl_Widget_Tracker wp(this);
    if (!Fl::event_inside(X, Y, W, H)) return 0;
    handle_push();
    if (wp.deleted()) return 1; }
    // fall through ...
  case FL_DRAG: {

    double val;
    if (minimum() == maximum())
      val = 0.5;
    else {
      val = (value()-minimum())/(maximum()-minimum());
      if (val > 1.0) val = 1.0;
      else if (val < 0.0) val = 0.0;
    }

    int ww = (horizontal() ? W : H);
    int mx = (horizontal() ? Fl::event_x()-X : Fl::event_y()-Y);
    int S;
    static int offcenter;

    if (type() == FL_HOR_FILL_SLIDER || type() == FL_VERT_FILL_SLIDER) {

      S = 0;
      if (event == FL_PUSH) {
	int xx = int(val*ww+.5);
	offcenter = mx-xx;
	if (offcenter < -10 || offcenter > 10) offcenter = 0;
	else return 1;
      }

    } else {

      S = int(slider_size_*ww+.5); if (S >= ww) return 0;
      int T = (horizontal() ? H : W)/2+1;
      if (type()==FL_VERT_NICE_SLIDER || type()==FL_HOR_NICE_SLIDER) T += 4;
      if (S < T) S = T;
      if (event == FL_PUSH) {
	int xx = int(val*(ww-S)+.5);
	offcenter = mx-xx;
	if (offcenter < 0) offcenter = 0;
	else if (offcenter > S) offcenter = S;
	else return 1;
      }
    }

    int xx = mx-offcenter;
    double v = 0;
    char tryAgain = 1;
    while (tryAgain)
    {
      tryAgain = 0;
      if (xx < 0) {
        xx = 0;
        offcenter = mx; if (offcenter < 0) offcenter = 0;
      } else if (xx > (ww-S)) {
        xx = ww-S;
        offcenter = mx-xx; if (offcenter > S) offcenter = S;
      }
      v = round(xx*(maximum()-minimum())/(ww-S) + minimum());
      // make sure a click outside the sliderbar moves it:
      if (event == FL_PUSH && v == value()) {
        offcenter = S/2;
        event = FL_DRAG;
        tryAgain = 1;
      }
    }
    handle_drag(clamp(v));
    } return 1;
  case FL_RELEASE:
    handle_release();
    return 1;
  case FL_KEYBOARD:
    { Fl_Widget_Tracker wp(this);
      switch (Fl::event_key()) {
	case FL_Up:
	  if (horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),-1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	case FL_Down:
	  if (horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	case FL_Left:
	  if (!horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),-1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	case FL_Right:
	  if (!horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	default:
	  return 0;
      }
    }
    // break not required because of switch...
  case FL_FOCUS :
  case FL_UNFOCUS :
    if (Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  case FL_ENTER :
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}